

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O3

void __thiscall CodeGen::generateRecordTraits(CodeGen *this,NodePtr *n)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar5;
  string fn;
  string local_70;
  string local_50;
  ulong uVar3;
  
  iVar2 = (*n->px->_vptr_Node[4])();
  uVar3 = CONCAT44(extraout_var,iVar2);
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      iVar2 = (*n->px->_vptr_Node[5])(n->px,uVar5 & 0xffffffff);
      generateTraits(this,(NodePtr *)CONCAT44(extraout_var_00,iVar2));
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  iVar2 = (*n->px->_vptr_Node[3])();
  lVar1 = *(long *)(CONCAT44(extraout_var_01,iVar2) + 0x20);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar1,*(long *)(CONCAT44(extraout_var_01,iVar2) + 0x28) + lVar1);
  fullname(&local_70,this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  poVar4 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"template<> struct codec_traits<",0x1f);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"> {\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"    static void encode(Encoder& e, const ",0x29);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"& v) {\n",7);
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      poVar4 = this->os_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"        avro::encode(e, v.",0x1a);
      iVar2 = (*n->px->_vptr_Node[8])(n->px,uVar5 & 0xffffffff);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,*(char **)CONCAT44(extraout_var_02,iVar2),
                          ((undefined8 *)CONCAT44(extraout_var_02,iVar2))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n",3);
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  poVar4 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"    static void decode(Decoder& d, ",0x23);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"& v) {\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->os_,"        if (avro::ResolvingDecoder *rd =\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->os_,"            dynamic_cast<avro::ResolvingDecoder *>(&d)) {\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->os_,"            const std::vector<size_t> fo = rd->fieldOrder();\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->os_,"            for (std::vector<size_t>::const_iterator it = fo.begin();\n",
             0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->os_,"                it != fo.end(); ++it) {\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->os_,"                switch (*it) {\n",0x1f);
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      poVar4 = this->os_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"                case ",0x15);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
      poVar4 = this->os_;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"                    avro::decode(d, v.",0x26);
      iVar2 = (*n->px->_vptr_Node[8])(n->px,uVar5 & 0xffffffff);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,*(char **)CONCAT44(extraout_var_03,iVar2),
                          ((undefined8 *)CONCAT44(extraout_var_03,iVar2))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (this->os_,"                    break;\n",0x1b);
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"                default:\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"                    break;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"                }\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"            }\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"        } else {\n",0x11);
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      poVar4 = this->os_;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"            avro::decode(d, v.",0x1e);
      iVar2 = (*n->px->_vptr_Node[8])(n->px,uVar5 & 0xffffffff);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,*(char **)CONCAT44(extraout_var_04,iVar2),
                          ((undefined8 *)CONCAT44(extraout_var_04,iVar2))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n",3);
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"        }\n",10);
  poVar4 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"};\n\n",4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CodeGen::generateRecordTraits(const NodePtr& n)
{
    size_t c = n->leaves();
    for (size_t i = 0; i < c; ++i) {
        generateTraits(n->leafAt(i));
    }

    string fn = fullname(decorate(n->name()));
    os_ << "template<> struct codec_traits<" << fn << "> {\n"
        << "    static void encode(Encoder& e, const " << fn << "& v) {\n";

    for (size_t i = 0; i < c; ++i) {
        os_ << "        avro::encode(e, v." << n->nameAt(i) << ");\n";
    }

    os_ << "    }\n"
        << "    static void decode(Decoder& d, " << fn << "& v) {\n";
    os_ << "        if (avro::ResolvingDecoder *rd =\n";
    os_ << "            dynamic_cast<avro::ResolvingDecoder *>(&d)) {\n";
    os_ << "            const std::vector<size_t> fo = rd->fieldOrder();\n";
    os_ << "            for (std::vector<size_t>::const_iterator it = fo.begin();\n";
    os_ << "                it != fo.end(); ++it) {\n";
    os_ << "                switch (*it) {\n";
    for (size_t i = 0; i < c; ++i) {
        os_ << "                case " << i << ":\n";
        os_ << "                    avro::decode(d, v." << n->nameAt(i) << ");\n";
        os_ << "                    break;\n";
    }
    os_ << "                default:\n";
    os_ << "                    break;\n";
    os_ << "                }\n";
    os_ << "            }\n";
    os_ << "        } else {\n";

    for (size_t i = 0; i < c; ++i) {
        os_ << "            avro::decode(d, v." << n->nameAt(i) << ");\n";
    }
    os_ << "        }\n";

    os_ << "    }\n"
        << "};\n\n";
}